

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeVCVTD(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  DecodeStatus DVar9;
  uint Vd;
  uint op;
  uint cmode;
  uint imm;
  uint Vm;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Insn_local;
  MCInst *Inst_local;
  
  imm = 3;
  _Vm = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Insn;
  pMStack_18 = Inst;
  uVar2 = fieldFromInstruction_4(Insn,0xc,4);
  uVar3 = fieldFromInstruction_4(Address_local._4_4_,0x16,1);
  uVar4 = fieldFromInstruction_4(Address_local._4_4_,0,4);
  uVar5 = fieldFromInstruction_4(Address_local._4_4_,5,1);
  uVar6 = fieldFromInstruction_4(Address_local._4_4_,0x10,6);
  uVar7 = fieldFromInstruction_4(Address_local._4_4_,8,4);
  uVar8 = fieldFromInstruction_4(Address_local._4_4_,5,1);
  if (((uVar6 & 0x38) == 0) && (uVar7 == 0xf)) {
    if (uVar8 == 1) {
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
    else {
      MCInst_setOpcode(pMStack_18,0x556);
      Inst_local._4_4_ =
           DecodeNEONModImmInstruction(pMStack_18,Address_local._4_4_,(uint64_t)Decoder_local,_Vm);
    }
  }
  else if ((uVar6 & 0x20) == 0) {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  else {
    DVar9 = DecodeDPRRegisterClass(pMStack_18,uVar3 << 4 | uVar2,(uint64_t)Decoder_local,_Vm);
    _Var1 = Check(&imm,DVar9);
    if (_Var1) {
      DVar9 = DecodeDPRRegisterClass(pMStack_18,uVar5 << 4 | uVar4,(uint64_t)Decoder_local,_Vm);
      _Var1 = Check(&imm,DVar9);
      if (_Var1) {
        MCOperand_CreateImm0(pMStack_18,(ulong)(0x40 - uVar6));
        Inst_local._4_4_ = imm;
      }
      else {
        Inst_local._4_4_ = MCDisassembler_Fail;
      }
    }
    else {
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeVCVTD(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned Vm, imm, cmode, op;
	unsigned Vd = (fieldFromInstruction_4(Insn, 12, 4) << 0);
	Vd |= (fieldFromInstruction_4(Insn, 22, 1) << 4);
	Vm = (fieldFromInstruction_4(Insn, 0, 4) << 0);
	Vm |= (fieldFromInstruction_4(Insn, 5, 1) << 4);
	imm = fieldFromInstruction_4(Insn, 16, 6);
	cmode = fieldFromInstruction_4(Insn, 8, 4);
	op = fieldFromInstruction_4(Insn, 5, 1);

	// VMOVv2f32 is ambiguous with these decodings.
	if (!(imm & 0x38) && cmode == 0xF) {
		if (op == 1) return MCDisassembler_Fail;
		MCInst_setOpcode(Inst, ARM_VMOVv2f32);
		return DecodeNEONModImmInstruction(Inst, Insn, Address, Decoder);
	}

	if (!(imm & 0x20)) return MCDisassembler_Fail;

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Vd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Vm, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, 64 - imm);

	return S;
}